

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 start,UChar32 end)

{
  uint uVar1;
  uint uVar2;
  UChar32 range [3];
  
  range[0] = 0x10ffff;
  if ((uint)start < 0x10ffff) {
    range[0] = start;
  }
  uVar1 = 0x10ffff;
  if ((uint)end < 0x10ffff) {
    uVar1 = end;
  }
  uVar2 = uVar1;
  if (end < 0) {
    uVar2 = 0;
  }
  if ((start < 0) || ((uint)range[0] <= uVar2)) {
    if (start < 0) {
      range[0] = 0;
    }
    range[1] = 1;
    if (-1 < end) {
      range[1] = uVar1 + 1;
    }
    range[2] = 0x110000;
    retain(this,range,2,'\0');
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::retain(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 0);
    } else {
        clear();
    }
    return *this;
}